

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::Calendar::computeWeekFields(Calendar *this,UErrorCode *ec)

{
  int dayOfWeek;
  int32_t dayOfPeriod;
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar6 = this->fFields[0x13];
    iVar8 = this->fFields[6];
    dayOfWeek = this->fFields[7];
    iVar7 = (int)((dayOfWeek - this->fFirstDayOfWeek) + 7) % 7;
    iVar4 = (int)((dayOfWeek - (this->fFirstDayOfWeek + iVar8)) + 0x1b59) % 7;
    iVar4 = (uint)((uint)this->fMinimalDaysInFirstWeek <= 7U - iVar4) + (iVar8 + iVar4 + -1) / 7;
    if (iVar4 == 0) {
      uVar6 = uVar6 - 1;
      iVar4 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar6);
      iVar4 = weekNumber(this,iVar8 + iVar4,dayOfWeek);
    }
    else {
      iVar1 = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar6);
      if (iVar1 + -5 <= iVar8) {
        iVar5 = ((iVar7 - iVar8) + iVar1) % 7;
        iVar2 = iVar5 + 7;
        if (-1 < iVar5) {
          iVar2 = iVar5;
        }
        if ((uint)this->fMinimalDaysInFirstWeek <= 6U - iVar2) {
          iVar8 = (iVar8 - iVar7) + 7;
          if (iVar1 < iVar8) {
            iVar4 = 1;
          }
          uVar6 = uVar6 + (iVar1 < iVar8);
        }
      }
    }
    this->fFields[3] = iVar4;
    this->fFields[0x11] = uVar6;
    dayOfPeriod = this->fFields[5];
    iVar3 = weekNumber(this,dayOfPeriod,dayOfWeek);
    this->fFields[4] = iVar3;
    this->fFields[8] = (dayOfPeriod + -1) / 7 + 1;
    return;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }